

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *
wasm::WATParser::locals<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  string_view id_00;
  bool bVar1;
  Name *pNVar2;
  Type *pTVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  string_view local_1d8;
  Err local_1c8;
  Err *local_1a8;
  Err *err_1;
  Result<wasm::Type> _val_1;
  Result<wasm::Type> type_1;
  allocator<char> local_131;
  string local_130;
  Err local_110;
  uint local_ec;
  Err local_e8;
  Err *local_c8;
  Err *err;
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  optional<wasm::Name> id;
  undefined1 local_38 [8];
  LocalsT res;
  bool hasAny;
  ParseModuleTypesCtx *ctx_local;
  
  res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeLocals
            ((LocalsT *)local_38,&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
  do {
    while( true ) {
      expected = sv("local",5);
      bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
      if (!bVar1) {
        if ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                    (__return_storage_ptr__);
          local_ec = 1;
        }
        else {
          MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>>::
          MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>>
                    ((MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>> *)
                     __return_storage_ptr__,
                     (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_38);
          local_ec = 1;
        }
        goto LAB_02427f5e;
      }
      res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      Lexer::takeID((optional<wasm::Name> *)
                    ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),&ctx->in);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      if (bVar1) break;
      while (bVar1 = Lexer::takeRParen(&ctx->in), ((bVar1 ^ 0xffU) & 1) != 0) {
        valtype<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
        Result<wasm::Type>::Result
                  ((Result<wasm::Type> *)&err_1,
                   (Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        local_1a8 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_1);
        bVar1 = local_1a8 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_1c8,local_1a8);
          MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                    (__return_storage_ptr__,&local_1c8);
          wasm::Err::~Err(&local_1c8);
        }
        local_ec = (uint)bVar1;
        Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_1);
        if (local_ec == 0) {
          wasm::Name::Name((Name *)&local_1d8);
          pTVar3 = Result<wasm::Type>::operator*
                             ((Result<wasm::Type> *)
                              ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::appendLocal
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                     (LocalsT *)local_38,(Name)local_1d8,(TypeT)pTVar3->id);
          local_ec = 0;
        }
        Result<wasm::Type>::~Result
                  ((Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        if (local_ec != 0) goto LAB_02427f5e;
      }
    }
    valtype<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
    Result<wasm::Type>::Result
              ((Result<wasm::Type> *)&err,
               (Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    local_c8 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err);
    bVar1 = local_c8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_e8,local_c8);
      MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                (__return_storage_ptr__,&local_e8);
      wasm::Err::~Err(&local_e8);
    }
    local_ec = (uint)bVar1;
    Result<wasm::Type>::~Result((Result<wasm::Type> *)&err);
    if (local_ec == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pNVar2 = std::optional<wasm::Name>::operator*
                           ((optional<wasm::Name> *)
                            ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        id_00 = (pNVar2->super_IString).str;
        pTVar3 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::appendLocal
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                   (LocalsT *)local_38,(Name)id_00,(TypeT)pTVar3->id);
        local_ec = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"expected end of local",&local_131);
        Lexer::err(&local_110,&ctx->in,&local_130);
        MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                  (__return_storage_ptr__,&local_110);
        wasm::Err::~Err(&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
        local_ec = 1;
      }
    }
    Result<wasm::Type>::~Result
              ((Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  } while (local_ec == 0);
LAB_02427f5e:
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LocalsT> locals(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeLocals();
  while (ctx.in.takeSExprStart("local"sv)) {
    hasAny = true;
    if (auto id = ctx.in.takeID()) {
      // Single named local
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of local");
      }
      ctx.appendLocal(res, *id, *type);
    } else {
      // Repeated unnamed locals
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendLocal(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}